

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

uint8_t av1_findSamples(AV1_COMMON *cm,MACROBLOCKD *xd,int *pts,int *pts_inref)

{
  byte bVar1;
  MB_MODE_INFO *mbmi_00;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  MB_MODE_INFO *mbmi_3;
  int mi_col_offset_2;
  int mi_row_offset_2;
  TileInfo *tile;
  POSITION trb_pos;
  MB_MODE_INFO *mbmi_2;
  int mi_col_offset_1;
  int mi_row_offset_1;
  int i_1;
  int row_offset;
  uint8_t superblock_height;
  MB_MODE_INFO *mbmi_1;
  int mi_col_offset;
  int i;
  int col_offset;
  uint8_t superblock_width;
  MB_MODE_INFO *mbmi;
  int mi_row_offset;
  int mi_col;
  int mi_row;
  int mi_stride;
  int do_tr;
  int do_tl;
  uint8_t np;
  int left_available;
  int up_available;
  int ref_frame;
  MB_MODE_INFO *mbmi0;
  uint local_e4;
  uint local_c8;
  uint local_c0;
  POSITION local_a0;
  MB_MODE_INFO *local_98;
  undefined4 local_8c;
  undefined4 local_88;
  int local_84;
  int local_80;
  byte local_79;
  MB_MODE_INFO *local_78;
  undefined4 local_70;
  int local_6c;
  int local_68;
  byte local_61;
  MB_MODE_INFO *local_60;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  byte local_3d;
  uint local_3c;
  uint local_38;
  int local_34;
  MB_MODE_INFO *local_30;
  int *local_28;
  int *local_20;
  MACROBLOCKD *local_18;
  AV1_COMMON *local_10;
  
  local_30 = *in_RSI->mi;
  local_34 = (int)local_30->ref_frame[0];
  local_38 = (uint)(in_RSI->up_available & 1);
  local_3c = (uint)(in_RSI->left_available & 1);
  local_3d = 0;
  local_44 = 1;
  local_48 = 1;
  local_4c = in_RSI->mi_stride;
  local_50 = in_RSI->mi_row;
  local_54 = in_RSI->mi_col;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_38 != 0) {
    local_58 = 0xffffffff;
    local_60 = in_RSI->mi[-local_4c];
    local_61 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [local_60->bsize];
    if (local_61 < in_RSI->width) {
      local_6c = 0;
      while( true ) {
        if ((int)(uint)local_18->width < (local_10->mi_params).mi_cols - local_54) {
          local_c0 = (uint)local_18->width;
        }
        else {
          local_c0 = (local_10->mi_params).mi_cols - local_54;
        }
        if ((int)local_c0 <= local_6c) break;
        local_60 = local_18->mi[local_6c - local_4c];
        local_61 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [local_60->bsize];
        if ((local_60->ref_frame[0] == local_34) && (local_60->ref_frame[1] == -1)) {
          record_samples(local_60,local_20,local_28,0,-1,local_6c,1);
          local_20 = local_20 + 2;
          local_28 = local_28 + 2;
          local_3d = local_3d + 1;
          if (7 < local_3d) {
            return '\b';
          }
        }
        local_6c = (uint)local_61 + local_6c;
      }
    }
    else {
      local_68 = -local_54 % (int)(uint)local_61;
      local_44 = (uint)(-1 < local_68);
      local_48 = (uint)((int)(local_68 + (uint)local_61) <= (int)(uint)in_RSI->width);
      if ((local_60->ref_frame[0] == local_34) && (local_60->ref_frame[1] == -1)) {
        record_samples(local_60,in_RDX,in_RCX,0,-1,local_68,1);
        local_20 = local_20 + 2;
        local_28 = local_28 + 2;
        local_3d = local_3d + 1;
        if (7 < local_3d) {
          return '\b';
        }
      }
    }
  }
  if (local_3c != 0) {
    local_70 = 0xffffffff;
    local_78 = local_18->mi[-1];
    local_79 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [local_78->bsize];
    if (local_79 < local_18->height) {
      local_84 = 0;
      while( true ) {
        if ((int)(uint)local_18->height < (local_10->mi_params).mi_rows - local_50) {
          local_c8 = (uint)local_18->height;
        }
        else {
          local_c8 = (local_10->mi_params).mi_rows - local_50;
        }
        if ((int)local_c8 <= local_84) break;
        local_78 = local_18->mi[local_84 * local_4c + -1];
        local_79 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [local_78->bsize];
        if ((local_78->ref_frame[0] == local_34) && (local_78->ref_frame[1] == -1)) {
          record_samples(local_78,local_20,local_28,local_84,1,0,-1);
          local_20 = local_20 + 2;
          local_28 = local_28 + 2;
          local_3d = local_3d + 1;
          if (7 < local_3d) {
            return '\b';
          }
        }
        local_84 = (uint)local_79 + local_84;
      }
    }
    else {
      local_80 = -local_50 % (int)(uint)local_79;
      if (local_80 < 0) {
        local_44 = 0;
      }
      if ((local_78->ref_frame[0] == local_34) && (local_78->ref_frame[1] == -1)) {
        record_samples(local_78,local_20,local_28,local_80,1,0,-1);
        local_20 = local_20 + 2;
        local_28 = local_28 + 2;
        local_3d = local_3d + 1;
        if (7 < local_3d) {
          return '\b';
        }
      }
    }
  }
  if (((local_44 != 0) && (local_3c != 0)) && (local_38 != 0)) {
    local_88 = 0xffffffff;
    local_8c = 0xffffffff;
    local_98 = local_18->mi[-1 - local_4c];
    if ((local_98->ref_frame[0] == local_34) && (local_98->ref_frame[1] == -1)) {
      record_samples(local_98,local_20,local_28,0,-1,0,-1);
      local_20 = local_20 + 2;
      local_28 = local_28 + 2;
      local_3d = local_3d + 1;
      if (7 < local_3d) {
        return '\b';
      }
    }
  }
  if (local_48 != 0) {
    if (local_18->height < local_18->width) {
      bVar1 = local_18->width;
    }
    else {
      bVar1 = local_18->height;
    }
    local_e4 = (uint)bVar1;
    iVar2 = has_top_right(local_10,local_18,local_50,local_54,local_e4);
    if (iVar2 != 0) {
      local_a0.row = -1;
      local_a0.col = (int)local_18->width;
      iVar2 = is_inside(&local_18->tile,local_54,local_50,&local_a0);
      if (((iVar2 != 0) &&
          (mbmi_00 = local_18->mi[(int)((uint)local_18->width - local_4c)],
          mbmi_00->ref_frame[0] == local_34)) && (mbmi_00->ref_frame[1] == -1)) {
        record_samples(mbmi_00,local_20,local_28,0,-1,(uint)local_18->width,1);
        local_3d = local_3d + 1;
        if (7 < local_3d) {
          return '\b';
        }
      }
    }
  }
  return local_3d;
}

Assistant:

uint8_t av1_findSamples(const AV1_COMMON *cm, MACROBLOCKD *xd, int *pts,
                        int *pts_inref) {
  const MB_MODE_INFO *const mbmi0 = xd->mi[0];
  const int ref_frame = mbmi0->ref_frame[0];
  const int up_available = xd->up_available;
  const int left_available = xd->left_available;
  uint8_t np = 0;
  int do_tl = 1;
  int do_tr = 1;
  const int mi_stride = xd->mi_stride;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // scan the nearest above rows
  if (up_available) {
    const int mi_row_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_row_offset * mi_stride];
    uint8_t superblock_width = mi_size_wide[mbmi->bsize];

    if (xd->width <= superblock_width) {
      // Handle "current block width <= above block width" case.
      const int col_offset = -mi_col % superblock_width;

      if (col_offset < 0) do_tl = 0;
      if (col_offset + superblock_width > xd->width) do_tr = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, col_offset, 1);
        pts += 2;
        pts_inref += 2;
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block width > above block width" case.
      for (int i = 0; i < AOMMIN(xd->width, cm->mi_params.mi_cols - mi_col);
           i += superblock_width) {
        mbmi = xd->mi[i + mi_row_offset * mi_stride];
        superblock_width = mi_size_wide[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, 0, -1, i, 1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // scan the nearest left columns
  if (left_available) {
    const int mi_col_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_col_offset];
    uint8_t superblock_height = mi_size_high[mbmi->bsize];

    if (xd->height <= superblock_height) {
      // Handle "current block height <= above block height" case.
      const int row_offset = -mi_row % superblock_height;

      if (row_offset < 0) do_tl = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, row_offset, 1, 0, -1);
        pts += 2;
        pts_inref += 2;
        np++;
        if (np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block height > above block height" case.
      for (int i = 0; i < AOMMIN(xd->height, cm->mi_params.mi_rows - mi_row);
           i += superblock_height) {
        mbmi = xd->mi[mi_col_offset + i * mi_stride];
        superblock_height = mi_size_high[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, i, 1, 0, -1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-left block
  if (do_tl && left_available && up_available) {
    const int mi_row_offset = -1;
    const int mi_col_offset = -1;
    MB_MODE_INFO *mbmi = xd->mi[mi_col_offset + mi_row_offset * mi_stride];

    if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
      record_samples(mbmi, pts, pts_inref, 0, -1, 0, -1);
      pts += 2;
      pts_inref += 2;
      if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-right block
  if (do_tr &&
      has_top_right(cm, xd, mi_row, mi_col, AOMMAX(xd->width, xd->height))) {
    const POSITION trb_pos = { -1, xd->width };
    const TileInfo *const tile = &xd->tile;
    if (is_inside(tile, mi_col, mi_row, &trb_pos)) {
      const int mi_row_offset = -1;
      const int mi_col_offset = xd->width;
      const MB_MODE_INFO *mbmi =
          xd->mi[mi_col_offset + mi_row_offset * mi_stride];

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, xd->width, 1);
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  return np;
}